

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void insert_or_append_to_polymap
               (map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                *target_map,int key,co_ord *polygon)

{
  _Rb_tree_header *p_Var1;
  pointer *this;
  void *pvVar2;
  _Base_ptr p_Var3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  bool bVar5;
  initializer_list<co_ord> __l;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  allocator_type local_61;
  co_ord local_60;
  vector<co_ord,_std::allocator<co_ord>_> local_30;
  
  p_Var3 = (target_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(target_map->_M_t)._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      bVar5 = p_Var3[1]._M_color < (uint)key;
      if (!bVar5) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar5];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var4[1]._M_color <= (uint)key)) {
      local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = key;
      this_00 = std::
                map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                ::operator[](target_map,(key_type_conflict *)&local_60);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this_00,polygon);
      return;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_60.x,&polygon->x);
  std::vector<int,_std::allocator<int>_>::vector(&local_60.y,&polygon->y);
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::vector<co_ord,_std::allocator<co_ord>_>::vector(&local_30,__l,&local_61);
  if (local_60.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  this = &local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish;
  local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = key;
  std::vector<co_ord,_std::allocator<co_ord>_>::vector
            ((vector<co_ord,_std::allocator<co_ord>_> *)this,&local_30);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
  ::_M_emplace_unique<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
              *)target_map,
             (pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> *)&local_60);
  std::vector<co_ord,_std::allocator<co_ord>_>::~vector
            ((vector<co_ord,_std::allocator<co_ord>_> *)this);
  std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&local_30);
  return;
}

Assistant:

void insert_or_append_to_polymap(
    std::map<unsigned int, std::vector<co_ord>> &target_map, int key,
    const co_ord &polygon)
{
  if (target_map.count(key) > 0) {
    target_map[key].push_back(polygon);
  } else {
    vector<co_ord> polygons = {polygon};
    target_map.insert(pair<unsigned int, vector<co_ord>>(key, polygons));
  }
}